

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::calcDrawBufferSize
          (ComputeShaderGeneratedCase *this)

{
  ComputeShaderGeneratedCase *this_local;
  
  if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
    this_local._4_4_ = this->m_gridSize * this->m_gridSize * 0xc;
  }
  else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    this_local._4_4_ = (this->m_gridSize + 1) * (this->m_gridSize + 1) * 4;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

deUint32 ComputeShaderGeneratedCase::calcDrawBufferSize (void) const
{
	// returns size in "vec4"s
	if (m_drawMethod == DRAWMETHOD_DRAWARRAYS)
		return m_gridSize*m_gridSize*6*2;
	else if (m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		return (m_gridSize+1)*(m_gridSize+1)*4;
	else
		DE_ASSERT(DE_FALSE);

	return 0;
}